

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

InputObject * anon_unknown.dwarf_694c0::verifyInput(HelicsInput inp,HelicsError *err)

{
  if (err == (HelicsError *)0x0) {
    if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
      return (InputObject *)inp;
    }
  }
  else if (err->error_code == 0) {
    if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
      return (InputObject *)inp;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
  return (InputObject *)0x0;
}

Assistant:

helics::InputObject* verifyInput(HelicsInput inp, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (inp == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidInputString);
        return nullptr;
    }
    auto* inpObj = reinterpret_cast<helics::InputObject*>(inp);
    if (inpObj->valid != InputValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidInputString);
        return nullptr;
    }
    return inpObj;
}